

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void add_reg_to_rw_list(MCInst *MI,m680x_reg reg,e_access access)

{
  cs_detail *pcVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint16_t uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  pcVar1 = MI->flat_insn->detail;
  if (reg == M680X_REG_INVALID || pcVar1 == (cs_detail *)0x0) {
    return;
  }
  uVar5 = (uint16_t)reg;
  if (access == READ) {
    uVar4 = (ulong)pcVar1->regs_read_count;
    bVar8 = uVar4 != 0;
    if (bVar8) {
      if (pcVar1->regs_read[0] == uVar5) {
        return;
      }
      uVar2 = 1;
      do {
        uVar6 = uVar2;
        if (uVar4 == uVar6) break;
        uVar2 = uVar6 + 1;
      } while (pcVar1->regs_read[uVar6] != uVar5);
      bVar8 = uVar6 < uVar4;
    }
    if (bVar8) {
      return;
    }
    pcVar1->regs_read_count = pcVar1->regs_read_count + 1;
    pcVar1->regs_read[uVar4] = uVar5;
    return;
  }
  if (access != WRITE) {
    if (access != MODIFY) {
      return;
    }
    uVar4 = (ulong)pcVar1->regs_read_count;
    bVar8 = uVar4 != 0;
    if (bVar8) {
      if (pcVar1->regs_read[0] == uVar5) goto LAB_0026b6be;
      uVar2 = 1;
      do {
        uVar6 = uVar2;
        if (uVar4 == uVar6) break;
        uVar2 = uVar6 + 1;
      } while (pcVar1->regs_read[uVar6] != uVar5);
      bVar8 = uVar6 < uVar4;
    }
    if (!bVar8) {
      pcVar1->regs_read_count = pcVar1->regs_read_count + 1;
      pcVar1->regs_read[uVar4] = uVar5;
    }
  }
LAB_0026b6be:
  uVar4 = (ulong)pcVar1->regs_write_count;
  bVar8 = uVar4 != 0;
  if (bVar8) {
    if (pcVar1->regs_write[0] == uVar5) {
      return;
    }
    lVar3 = 0;
    do {
      lVar7 = lVar3;
      if (uVar4 - 1 == lVar7) break;
      lVar3 = lVar7 + 1;
    } while (pcVar1->regs_write[lVar7 + 1] != uVar5);
    bVar8 = lVar7 + 1U < uVar4;
  }
  if (bVar8) {
    return;
  }
  pcVar1->regs_write_count = pcVar1->regs_write_count + 1;
  pcVar1->regs_write[uVar4] = uVar5;
  return;
}

Assistant:

static void add_reg_to_rw_list(m68k_info *info, m68k_reg reg, int write)
{
	if (reg == M68K_REG_INVALID)
		return;

	if (write)
	{
		if (exists_reg_list(info->regs_write, info->regs_write_count, reg))
			return;

		info->regs_write[info->regs_write_count] = (uint16_t)reg;
		info->regs_write_count++;
	}
	else
	{
		if (exists_reg_list(info->regs_read, info->regs_read_count, reg))
			return;

		info->regs_read[info->regs_read_count] = (uint16_t)reg;
		info->regs_read_count++;
	}
}